

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O3

void idx2::Clone(buffer *Src,buffer *Dst,allocator *Alloc)

{
  byte *__dest;
  
  __dest = Dst->Data;
  if (__dest != (byte *)0x0) {
    if (Dst->Bytes == Src->Bytes) goto LAB_0018710b;
    (*Dst->Alloc->_vptr_allocator[1])(Dst->Alloc,Dst);
    __dest = Dst->Data;
    if (__dest != (byte *)0x0) goto LAB_0018710b;
  }
  if (Dst->Bytes == 0) {
    (**Alloc->_vptr_allocator)(Alloc,Dst,Src->Bytes);
    __dest = Dst->Data;
  }
  else {
    __dest = (byte *)0x0;
  }
LAB_0018710b:
  memcpy(__dest,Src->Data,Src->Bytes);
  return;
}

Assistant:

void
Clone(const buffer& Src, buffer* Dst, allocator* Alloc)
{
  if (Dst->Data && Dst->Bytes != Src.Bytes)
    DeallocBuf(Dst);
  if (!Dst->Data && Dst->Bytes == 0)
    Alloc->Alloc(Dst, Src.Bytes);
  MemCopy(Src, Dst);
}